

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::~cmCTestRunTest(cmCTestRunTest *this)

{
  cmCTestRunTest *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Arguments);
  std::__cxx11::string::~string((string *)&this->ActualCommand);
  std::__cxx11::string::~string((string *)&this->StartTime);
  cmCTestTestHandler::cmCTestTestResult::~cmCTestTestResult(&this->TestResult);
  std::__cxx11::string::~string((string *)&this->CompressedOutput);
  std::__cxx11::string::~string((string *)&this->ProcessOutput);
  std::__cxx11::string::~string((string *)&this->PrefixCommand);
  return;
}

Assistant:

cmCTestRunTest::~cmCTestRunTest()
{
}